

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Materials.cpp
# Opt level: O2

SP __thiscall pbrt::SemanticParser::createMaterial_metal(SemanticParser *this,SP *in)

{
  undefined1 *puVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  SemanticParser *pSVar3;
  bool bVar4;
  long lVar5;
  _Rb_tree_node_base *p_Var6;
  runtime_error *this_00;
  long *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  float fVar7;
  SP SVar8;
  SP mat;
  size_t N;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_108 [3];
  SemanticParser *local_f0;
  _Rb_tree_node_base *local_e8;
  undefined1 local_e0 [32];
  undefined1 local_c0 [16];
  undefined1 local_b0 [16];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
  it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string name;
  
  local_f0 = this;
  std::make_shared<pbrt::MetalMaterial,std::__cxx11::string&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mat);
  p_Var6 = *(_Rb_tree_node_base **)(*in_RDX + 0x18);
  local_e8 = (_Rb_tree_node_base *)(*in_RDX + 8);
  do {
    pSVar3 = local_f0;
    _Var2._M_pi = mat.super___shared_ptr<pbrt::MetalMaterial,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    if (p_Var6 == local_e8) {
      mat.super___shared_ptr<pbrt::MetalMaterial,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (local_f0->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           mat.super___shared_ptr<pbrt::MetalMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (local_f0->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = _Var2._M_pi;
      mat.super___shared_ptr<pbrt::MetalMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&mat.super___shared_ptr<pbrt::MetalMaterial,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      SVar8.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           extraout_RDX._M_pi;
      SVar8.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)pSVar3;
      return (SP)SVar8.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>;
    }
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
    ::pair(&it,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
                *)(p_Var6 + 1));
    std::__cxx11::string::string((string *)&name,(string *)&it);
    bVar4 = std::operator==(&name,"roughness");
    if (bVar4) {
      bVar4 = syntactic::ParamSet::hasParamTexture((ParamSet *)*in_RDX,&name);
      if (bVar4) {
        syntactic::ParamSet::getParamTexture((ParamSet *)local_b0,(string *)*in_RDX);
        findOrCreateTexture((SemanticParser *)&N,(SP *)in);
        std::__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&((mat.super___shared_ptr<pbrt::MetalMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     )->map_roughness).super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>
                   ,(__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2> *)&N);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_108);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b0 + 8));
      }
      else {
        fVar7 = syntactic::ParamSet::getParam1f((ParamSet *)*in_RDX,&name,0.0);
        (mat.super___shared_ptr<pbrt::MetalMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->roughness
             = fVar7;
      }
    }
    else {
      bVar4 = std::operator==(&name,"uroughness");
      if (bVar4) {
        bVar4 = syntactic::ParamSet::hasParamTexture((ParamSet *)*in_RDX,&name);
        if (bVar4) {
          syntactic::ParamSet::getParamTexture((ParamSet *)local_c0,(string *)*in_RDX);
          findOrCreateTexture((SemanticParser *)&N,(SP *)in);
          std::__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>::operator=
                    (&((mat.super___shared_ptr<pbrt::MetalMaterial,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->map_uRoughness).
                      super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>,
                     (__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2> *)&N);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_108);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c0 + 8));
        }
        else {
          fVar7 = syntactic::ParamSet::getParam1f((ParamSet *)*in_RDX,&name,0.0);
          (mat.super___shared_ptr<pbrt::MetalMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          uRoughness = fVar7;
        }
      }
      else {
        bVar4 = std::operator==(&name,"vroughness");
        if (bVar4) {
          bVar4 = syntactic::ParamSet::hasParamTexture((ParamSet *)*in_RDX,&name);
          if (bVar4) {
            syntactic::ParamSet::getParamTexture((ParamSet *)(local_e0 + 0x10),(string *)*in_RDX);
            findOrCreateTexture((SemanticParser *)&N,(SP *)in);
            std::__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>::operator=
                      (&((mat.super___shared_ptr<pbrt::MetalMaterial,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->map_vRoughness).
                        super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>,
                       (__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2> *)&N);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_108);
            puVar1 = local_e0 + 0x10;
LAB_00151d52:
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(puVar1 + 8));
          }
          else {
            fVar7 = syntactic::ParamSet::getParam1f((ParamSet *)*in_RDX,&name,0.0);
            (mat.super___shared_ptr<pbrt::MetalMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            vRoughness = fVar7;
          }
        }
        else {
          bVar4 = std::operator==(&name,"remaproughness");
          if (bVar4) {
            bVar4 = syntactic::ParamSet::getParamBool((ParamSet *)*in_RDX,&name,false);
            (mat.super___shared_ptr<pbrt::MetalMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            remapRoughness = bVar4;
          }
          else {
            bVar4 = std::operator==(&name,"eta");
            if (bVar4) {
              bVar4 = syntactic::ParamSet::hasParam3f((ParamSet *)*in_RDX,&name);
              if (bVar4) {
                lVar5 = 0x84;
LAB_00151e50:
                syntactic::ParamSet::getParam3f
                          ((ParamSet *)*in_RDX,
                           (float *)((long)&((mat.
                                              super___shared_ptr<pbrt::MetalMaterial,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr)->super_Material).super_Entity._vptr_Entity +
                                    lVar5),&name);
              }
              else {
                N = 0;
                syntactic::ParamSet::getParamPairNf((ParamSet *)*in_RDX,(value_type *)0x0,&N,&name);
                std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>::
                resize(&((mat.super___shared_ptr<pbrt::MetalMaterial,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->spectrum_eta).spd,N);
                syntactic::ParamSet::getParamPairNf
                          ((ParamSet *)*in_RDX,
                           ((mat.super___shared_ptr<pbrt::MetalMaterial,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->spectrum_eta).spd.
                           super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,&N,&name);
              }
            }
            else {
              bVar4 = std::operator==(&name,"k");
              if (bVar4) {
                bVar4 = syntactic::ParamSet::hasParam3f((ParamSet *)*in_RDX,&name);
                if (bVar4) {
                  lVar5 = 0xc0;
                  goto LAB_00151e50;
                }
                N = 0;
                syntactic::ParamSet::getParamPairNf((ParamSet *)*in_RDX,(value_type *)0x0,&N,&name);
                std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>::
                resize(&((mat.super___shared_ptr<pbrt::MetalMaterial,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->spectrum_k).spd,N);
                syntactic::ParamSet::getParamPairNf
                          ((ParamSet *)*in_RDX,
                           ((mat.super___shared_ptr<pbrt::MetalMaterial,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->spectrum_k).spd.
                           super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,&N,&name);
              }
              else {
                bVar4 = std::operator==(&name,"bumpmap");
                if (bVar4) {
                  syntactic::ParamSet::getParamTexture((ParamSet *)local_e0,(string *)*in_RDX);
                  findOrCreateTexture((SemanticParser *)&N,(SP *)in);
                  std::__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>::operator=
                            (&((mat.
                                super___shared_ptr<pbrt::MetalMaterial,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->map_bump).
                              super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>,
                             (__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2> *)&N);
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_108);
                  puVar1 = local_e0;
                  goto LAB_00151d52;
                }
                bVar4 = std::operator==(&name,"type");
                if (!bVar4) {
                  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::operator+(&local_70,"un-handled metal-material parameter \'",&it.first);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&N,&local_70,"\'");
                  std::runtime_error::runtime_error(this_00,(string *)&N);
                  __cxa_throw(this_00,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)&name);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
    ::~pair(&it);
    p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
  } while( true );
}

Assistant:

Material::SP SemanticParser::createMaterial_metal(pbrt::syntactic::Material::SP in)
  {
    MetalMaterial::SP mat = std::make_shared<MetalMaterial>(in->name);
    for (auto it : in->param) {
      std::string name = it.first;
      if (name == "roughness") {
        if (in->hasParamTexture(name))
          mat->map_roughness = findOrCreateTexture(in->getParamTexture(name));
        else
          mat->roughness = in->getParam1f(name);
      }
      else if (name == "uroughness") {
        if (in->hasParamTexture(name))
          mat->map_uRoughness = findOrCreateTexture(in->getParamTexture(name));
        else
          mat->uRoughness = in->getParam1f(name);
      }
      else if (name == "vroughness") {
        if (in->hasParamTexture(name))
          mat->map_vRoughness = findOrCreateTexture(in->getParamTexture(name));
        else
          mat->vRoughness = in->getParam1f(name);
      }
      else if (name == "remaproughness") {
        mat->remapRoughness = in->getParamBool(name);
      }
      else if (name == "eta") {
        if (in->hasParam3f(name))
          in->getParam3f(&mat->eta.x,name);
        else {
          std::size_t N=0;
          in->getParamPairNf(nullptr,&N,name);
          mat->spectrum_eta.spd.resize(N);
          in->getParamPairNf(mat->spectrum_eta.spd.data(),&N,name);
        }
      }
      else if (name == "k") {
        if (in->hasParam3f(name))
          in->getParam3f(&mat->k.x,name);
        else {
          std::size_t N=0;
          in->getParamPairNf(nullptr,&N,name);
          mat->spectrum_k.spd.resize(N);
          in->getParamPairNf(mat->spectrum_k.spd.data(),&N,name);
        }
      }
      else if (name == "bumpmap") {
        mat->map_bump = findOrCreateTexture(in->getParamTexture(name));
      }
      else if (name == "type") {
        /* ignore */
      } else
        throw std::runtime_error("un-handled metal-material parameter '"+it.first+"'");
    };
    return mat;
  }